

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O0

int xmllintShellDir(xmllintShellCtxtPtr ctxt,char *arg,xmlNodePtr node,xmlNodePtr node2)

{
  xmlNodePtr node2_local;
  xmlNodePtr node_local;
  char *arg_local;
  xmllintShellCtxtPtr ctxt_local;
  
  if (ctxt != (xmllintShellCtxtPtr)0x0) {
    if (node == (xmlNodePtr)0x0) {
      fprintf((FILE *)ctxt->output,"NULL\n");
    }
    else if ((node->type == XML_DOCUMENT_NODE) || (node->type == XML_HTML_DOCUMENT_NODE)) {
      xmlDebugDumpDocumentHead(ctxt->output,node);
    }
    else if (node->type == XML_ATTRIBUTE_NODE) {
      xmlDebugDumpAttr(ctxt->output,node,0);
    }
    else {
      xmlDebugDumpOneNode(ctxt->output,node,0);
    }
  }
  return 0;
}

Assistant:

static int
xmllintShellDir(xmllintShellCtxtPtr ctxt ATTRIBUTE_UNUSED,
            char *arg ATTRIBUTE_UNUSED, xmlNodePtr node,
            xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    if (!ctxt)
        return (0);
    if (node == NULL) {
	fprintf(ctxt->output, "NULL\n");
	return (0);
    }
#ifdef LIBXML_DEBUG_ENABLED
    if ((node->type == XML_DOCUMENT_NODE) ||
        (node->type == XML_HTML_DOCUMENT_NODE)) {
        xmlDebugDumpDocumentHead(ctxt->output, (xmlDocPtr) node);
    } else if (node->type == XML_ATTRIBUTE_NODE) {
        xmlDebugDumpAttr(ctxt->output, (xmlAttrPtr) node, 0);
    } else {
        xmlDebugDumpOneNode(ctxt->output, node, 0);
    }
#endif
    return (0);
}